

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O3

void adios2::utils::print_decomp_singlestep<short>(Engine *fp,IO *io,Variable<short> *variable)

{
  DataType adiosvartype;
  uint uVar1;
  int __c;
  int iVar2;
  undefined8 uVar3;
  void *pvVar4;
  Variable<short> *pVVar5;
  long lVar6;
  long lVar7;
  pointer pBVar8;
  undefined8 *puVar9;
  char *__format;
  short *psVar10;
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  *pvVar11;
  ulong uVar12;
  int iVar13;
  pointer pBVar14;
  long lVar15;
  size_t blockid;
  ulong uVar16;
  byte bVar17;
  int ndigits_dims [32];
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  local_158;
  Variable<short> *local_138;
  ulong local_130;
  pointer local_128;
  pointer local_120;
  Engine *local_118;
  IO *local_110;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  local_d8;
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  local_b8 [5];
  
  bVar17 = 0;
  adiosvartype = *(DataType *)(variable + 0x28);
  local_110 = io;
  uVar3 = (**(code **)(*(long *)fp + 0x20))();
  pvVar4 = (void *)(**(code **)(*(long *)fp + 0x58))(fp,variable,uVar3);
  local_158.
  super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118 = fp;
  if (pvVar4 == (void *)0x0) {
    (**(code **)(*(long *)fp + 0x20))(fp);
    adios2::core::Engine::BlocksInfo<short>((Variable *)&local_d8,(ulong)fp);
    local_b8[0].
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_158.
         super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8[0].
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_158.
         super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8[0].
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_158.
         super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_158.
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_d8.
         super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_158.
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_d8.
         super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_158.
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_d8.
         super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_d8.
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ::~vector(local_b8);
    std::
    vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
    ::~vector(&local_d8);
    lVar6 = 400;
    pBVar8 = local_158.
             super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar14 = local_158.
              super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_158.
        super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_158.
        super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0012d9dd;
  }
  else {
    lVar6 = 0x50;
    pBVar8 = *(pointer *)((long)pvVar4 + 0x28);
    pBVar14 = *(pointer *)((long)pvVar4 + 0x20);
  }
  local_130 = ((long)pBVar8 - (long)pBVar14) / lVar6;
  uVar16 = local_130 - 1;
  uVar1 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",uVar16);
  if ((*(int *)(variable + 0x40) == 4) || (*(int *)(variable + 0x40) == 1)) {
    if (dump == '\x01') {
      iVar2 = 1;
      if (adiosvartype != String) {
        iVar2 = ncols;
      }
      if (pBVar8 != pBVar14) {
        lVar6 = 0x40;
        uVar12 = 0;
        iVar13 = 0;
        do {
          if ((iVar13 == 0) && (noindex == '\0')) {
            fprintf(outf,"    (%*zu)    ",(ulong)uVar1,uVar12);
          }
          if (pvVar4 == (void *)0x0) {
            psVar10 = &local_158.
                       super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].Value;
          }
          else {
            psVar10 = (short *)(*(long *)((long)pvVar4 + 0x20) + lVar6);
          }
          print_data(psVar10,0,adiosvartype,true,false);
          iVar13 = iVar13 + 1;
          if (uVar12 < uVar16) {
            __c = 0x20;
            if (iVar2 <= iVar13) {
              iVar13 = 0;
              __c = 10;
            }
            fputc(__c,outf);
          }
          uVar12 = uVar12 + 1;
          lVar6 = lVar6 + 0x50;
        } while (local_130 != uVar12);
      }
      fputc(10,outf);
    }
  }
  else {
    lVar6 = *(long *)(variable + 0x88);
    lVar15 = *(long *)(variable + 0x90);
    puVar9 = &DAT_00169110;
    pvVar11 = local_b8;
    for (lVar7 = 0x10; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pvVar11->
      super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar9;
      puVar9 = puVar9 + (ulong)bVar17 * -2 + 1;
      pvVar11 = (vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                 *)((long)pvVar11 + ((ulong)bVar17 * -2 + 1) * 8);
    }
    local_128 = pBVar8;
    local_120 = pBVar14;
    if (lVar15 - lVar6 != 0) {
      lVar6 = lVar15 - lVar6 >> 3;
      lVar15 = 0;
      do {
        pVVar5 = variable + 0x88;
        if (*(int *)(variable + 0x40) == 2) {
          pVVar5 = variable + 0x58;
        }
        iVar2 = snprintf(ndigits(unsigned_long)::digitstr,0x20,"%zu",
                         *(long *)(*(long *)pVVar5 + lVar15 * 8) + -1);
        *(int *)((long)&local_b8[0].
                        super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar15 * 4) = iVar2;
        lVar15 = lVar15 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar15);
    }
    if (local_128 != local_120) {
      blockid = 0;
      local_138 = variable;
      do {
        fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar);
        if (*(long *)(variable + 0x90) - *(long *)(variable + 0x88) != 0) {
          lVar6 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
          uVar16 = 0;
          do {
            if (pvVar4 == (void *)0x0) {
              if (local_158.
                  super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start[blockid].Count.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar16] == 0) goto LAB_0012d7c1;
              uVar1 = *(uint *)((long)&local_b8[0].
                                       super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar16 * 4);
              if (*(int *)(local_138 + 0x40) != 2) goto LAB_0012d7e7;
LAB_0012d7a0:
              fprintf(outf,"%*zu:%*zu");
            }
            else {
              if (*(long *)(*(long *)(*(long *)((long)pvVar4 + 0x20) + 0x18 + blockid * 0x50) +
                           uVar16 * 8) == 0) {
LAB_0012d7c1:
                uVar1 = *(int *)((long)&local_b8[0].
                                        super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar16 * 4) * 2
                        + 1;
                __format = "%-*s";
              }
              else {
                uVar1 = *(uint *)((long)&local_b8[0].
                                         super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar16 * 4);
                if (*(int *)(local_138 + 0x40) == 2) goto LAB_0012d7a0;
LAB_0012d7e7:
                __format = "0:%*zu";
              }
              fprintf(outf,__format,(ulong)uVar1);
            }
            if (uVar16 < lVar6 - 1U) {
              fwrite(", ",2,1,outf);
            }
            uVar16 = uVar16 + 1;
          } while (lVar6 + (ulong)(lVar6 == 0) != uVar16);
        }
        fputc(0x5d,outf);
        if (longopt != '\0') {
          fwrite(" = ",3,1,outf);
          if (pvVar4 == (void *)0x0) {
            print_data(&local_158.
                        super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start[blockid].Min,0,adiosvartype,false,
                       false);
            fwrite(" / ",3,1,outf);
            psVar10 = &local_158.
                       super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start[blockid].Max;
          }
          else {
            print_data((void *)(*(long *)((long)pvVar4 + 0x20) + blockid * 0x50 + 0x20),0,
                       adiosvartype,false,false);
            fwrite(" / ",3,1,outf);
            psVar10 = (short *)(*(long *)((long)pvVar4 + 0x20) + blockid * 0x50 + 0x30);
          }
          print_data(psVar10,0,adiosvartype,false,false);
        }
        fputc(10,outf);
        variable = local_138;
        if ((pvVar4 == (void *)0x0) && (dump != '\0')) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_108,
                     &local_158.
                      super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start[blockid].Count);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_f0,
                     &local_158.
                      super__Vector_base<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start[blockid].Start);
          readVarBlock<short>(local_118,local_110,variable,0,blockid,&local_108,&local_f0);
          if (local_f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        blockid = blockid + 1;
      } while (blockid != local_130);
    }
    if (pvVar4 != (void *)0x0) {
      if (*(void **)((long)pvVar4 + 0x20) != (void *)0x0) {
        operator_delete(*(void **)((long)pvVar4 + 0x20));
      }
      operator_delete(pvVar4);
    }
  }
LAB_0012d9dd:
  std::
  vector<adios2::core::Variable<short>::BPInfo,_std::allocator<adios2::core::Variable<short>::BPInfo>_>
  ::~vector(&local_158);
  return;
}

Assistant:

void print_decomp_singlestep(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    /* Print block info */
    DataType adiosvartype = variable->m_Type;
    const auto minBlocks = fp->MinBlocksInfo(*variable, fp->CurrentStep());

    std::vector<typename core::Variable<T>::BPInfo> coreBlocks;

    if (!minBlocks)
    {
        coreBlocks = fp->BlocksInfo(*variable, fp->CurrentStep());
    }
    if (!minBlocks && coreBlocks.empty())
    {
        return;
    }

    size_t blocksSize;
    if (minBlocks)
    {
        blocksSize = minBlocks->BlocksInfo.size();
    }
    else
    {
        blocksSize = coreBlocks.size();
    }
    const int ndigits_nblocks = ndigits(blocksSize - 1);

    if (variable->m_ShapeID == ShapeID::GlobalValue || variable->m_ShapeID == ShapeID::LocalValue)
    {
        // scalars
        if (dump)
        {
            int col = 0;
            int maxcols = ncols;
            if (adiosvartype == DataType::String)
            {
                maxcols = 1;
            }
            for (size_t j = 0; j < blocksSize; j++)
            {
                if (col == 0 && !noindex)
                {
                    fprintf(outf, "    (%*zu)    ", ndigits_nblocks, j);
                }
                if (!minBlocks)
                    print_data(&coreBlocks[j].Value, 0, adiosvartype, true);
                else
                    print_data(&minBlocks->BlocksInfo[j].BufferP, 0, adiosvartype, true);
                ++col;
                if (j < blocksSize - 1)
                {
                    if (col < maxcols)
                    {
                        fprintf(outf, " ");
                    }
                    else
                    {
                        col = 0;
                        fprintf(outf, "\n");
                    }
                }
            }
            fprintf(outf, "\n");
        }
        return;
    }
    else
    {
        // arrays
        size_t ndim = variable->m_Count.size();
        int ndigits_dims[32] = {
            8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8,
            8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8, 8,
        };
        for (size_t k = 0; k < ndim; k++)
        {
            // get digit lengths for each dimension
            if (variable->m_ShapeID == ShapeID::GlobalArray)
            {
                ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
            }
            else
            {
                ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
            }
        }

        size_t stepRelative = 0;

        for (size_t j = 0; j < blocksSize; j++)
        {
            fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

            // just in case ndim for a block changes in LocalArrays:
            ndim = variable->m_Count.size();

            for (size_t k = 0; k < ndim; k++)
            {
                if (!minBlocks)
                {
                    if (coreBlocks[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k], coreBlocks[j].Start[k],
                                    ndigits_dims[k],
                                    coreBlocks[j].Start[k] + coreBlocks[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k], coreBlocks[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                }
                else
                {
                    if (minBlocks->BlocksInfo[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Start[k], ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Start[k] +
                                        minBlocks->BlocksInfo[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k],
                                    minBlocks->BlocksInfo[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                }
                if (k < ndim - 1)
                    fprintf(outf, ", ");
            }
            fprintf(outf, "]");

            /* Print per-block statistics if available */
            if (longopt)
            {
                if (true /* TODO: variable->has_minmax */)
                {
                    if (!minBlocks)
                    {
                        fprintf(outf, " = ");
                        print_data(&coreBlocks[j].Min, 0, adiosvartype, false);

                        fprintf(outf, " / ");
                        print_data(&coreBlocks[j].Max, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, " = ");
                        print_data(&minBlocks->BlocksInfo[j].MinMax.MinUnion, 0, adiosvartype,
                                   false);

                        fprintf(outf, " / ");
                        print_data(&minBlocks->BlocksInfo[j].MinMax.MaxUnion, 0, adiosvartype,
                                   false);
                    }
                }
                else
                {
                    fprintf(outf, "N/A / N/A");
                }
            }
            fprintf(outf, "\n");
            if (dump)
            {
                if (!minBlocks)
                {
                    readVarBlock(fp, io, variable, stepRelative, j, coreBlocks[j].Count,
                                 coreBlocks[j].Start);
                }
                else
                {
                    // GSE todo
                }
            }
        }
        ++stepRelative;
    }
    if (minBlocks)
        delete minBlocks;
}